

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

uint aom_avg_4x4_c(uint8_t *s,int p)

{
  int sum;
  int j;
  int i;
  int p_local;
  uint8_t *s_local;
  
  sum = 0;
  s_local = s;
  for (i = 0; i < 4; i = i + 1) {
    for (j = 0; j < 4; j = j + 1) {
      sum = (uint)s_local[j] + sum;
    }
    s_local = s_local + p;
  }
  return sum + 8 >> 4;
}

Assistant:

unsigned int aom_avg_4x4_c(const uint8_t *s, int p) {
  int i, j;
  int sum = 0;
  for (i = 0; i < 4; ++i, s += p)
    for (j = 0; j < 4; sum += s[j], ++j) {
    }

  return (sum + 8) >> 4;
}